

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string.h
# Opt level: O1

char * __thiscall google::protobuf::internal::MicroString::LargeRep::owned_head(LargeRep *this)

{
  Nonnull<const_char_*> pcVar1;
  
  if ((ulong)this->capacity < 3) {
    pcVar1 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       ((ulong)this->capacity,3,"capacity >= kOwned");
  }
  else {
    pcVar1 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar1 == (Nonnull<const_char_*>)0x0) {
    return (char *)(this + 1);
  }
  owned_head();
}

Assistant:

char* owned_head() {
      ABSL_DCHECK_GE(capacity, kOwned);
      return reinterpret_cast<char*>(this + 1);
    }